

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_multiple_bindings_initializer_list.cpp
# Opt level: O3

int main(void)

{
  vector<int,_std::allocator<int>_> v;
  i injector;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c [3];
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  local_20;
  
  local_20.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.object_.
  _M_array = local_2c;
  local_2c[0] = 1;
  local_2c[1] = 2;
  local_2c[2] = 3;
  local_20.
  super_pool<boost::ext::di::v1_3_0::aux::type_list<boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>_>
  .
  super_dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>
  .super_scope<boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_int>.object_.
  _M_len = 3;
  boost::ext::di::v1_3_0::core::
  injector<boost::ext::di::v1_3_0::config,_boost::ext::di::v1_3_0::core::pool<boost::ext::di::v1_3_0::aux::type_list<>_>,_boost::ext::di::v1_3_0::core::dependency<boost::ext::di::v1_3_0::scopes::instance,_boost::ext::di::v1_3_0::core::array<int>,_std::initializer_list<int>,_boost::ext::di::v1_3_0::no_name,_void,_boost::ext::di::v1_3_0::core::none>_>
  ::create<std::vector<int,_std::allocator<int>_>,_0>(&local_48,&local_20);
  if ((long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish -
      (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != 0xc) {
    __assert_fail("3 == v.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                  ,0x28,"int main()");
  }
  if (*local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start != 1) {
    __assert_fail("1 == v[0]",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                  ,0x29,"int main()");
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[1] != 2) {
    __assert_fail("2 == v[1]",
                  "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                  ,0x2a,"int main()");
  }
  if (local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start[2] == 3) {
    operator_delete(local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_48.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
    return 0;
  }
  __assert_fail("3 == v[2]",
                "/workspace/llm4binary/github/license_c_cmakelists/boost-ext[P]di/example/user_guide/bind_multiple_bindings_initializer_list.cpp"
                ,0x2b,"int main()");
}

Assistant:

int main() {
  // clang-format off
  auto il = {1, 2, 3};
  auto injector = di::make_injector(
    di::bind<int[]>().to(il) // or di::bind<int*[]>.to(il)
  );
  // clang-format on

  auto v = injector.create<std::vector<int>>();
  assert(3 == v.size());
  assert(1 == v[0]);
  assert(2 == v[1]);
  assert(3 == v[2]);
}